

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O3

void __thiscall
slang::driver::SourceLoader::SourceLoader(SourceLoader *this,SourceManager *sourceManager)

{
  deque<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  *this_00;
  flat_hash_set<std::string_view> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  short *psVar4;
  int iVar5;
  ushort uVar6;
  _Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  *p_Var7;
  uint64_t uVar8;
  char_pointer puVar9;
  ulong uVar10;
  char_pointer puVar11;
  group_type_pointer pgVar12;
  char_pointer puVar13;
  ulong uVar14;
  long lVar15;
  ulong pos0;
  uint uVar16;
  value_type *elements;
  value_type_pointer pbVar17;
  table_element_pointer pbVar18;
  char cVar19;
  uchar uVar20;
  char cVar23;
  uchar uVar24;
  char cVar25;
  uchar uVar26;
  byte bVar27;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  iterator iVar30;
  locator res;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  size_t local_a0;
  SyntaxTreeList *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *local_88;
  deque<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  *local_80;
  undefined1 local_78 [32];
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  this->sourceManager = sourceManager;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.groups_size_mask = 1;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  pgVar12 = (group_type_pointer)
            &boost::unordered::detail::foa::
             dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
             ::storage;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .size_ctrl.ml = 0;
  (this->fileIndex).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  .size_ctrl.size = 0;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  this_00 = &this->unitEntries;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .size_ctrl.ml = 0;
  (this->libraries).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::unique_ptr<slang::SourceLibrary>_>_>_>
  .size_ctrl.size = 0;
  (this->unitEntries).
  super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->unitEntries).
  super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  p_Var7 = &(this->unitEntries).
            super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  p_Var7 = &(this->unitEntries).
            super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  p_Var7 = &(this->unitEntries).
            super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ;
  (p_Var7->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (p_Var7->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  p_Var7 = &(this->unitEntries).
            super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ;
  (p_Var7->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (p_Var7->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ::_M_initialize_map(&this_00->
                       super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
                      ,0);
  local_88 = &this->searchDirectories;
  arrays_ = &this->uniqueExtensions;
  (this->searchExtensions).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->searchExtensions).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->searchDirectories).
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->searchDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->searchDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_mask = 1;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_90 = &this->errors;
  local_98 = &this->libraryMapTrees;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.ml = 0;
  (this->uniqueExtensions).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.size = 0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->errors).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->libraryMapTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->libraryMapTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0._M_len = 2;
  local_b0._M_str = ".v";
  uVar8 = detail::hashing::hash(".v",2);
  uVar10 = uVar8 >> 0x3f;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar8 & 0xff];
  pbVar17 = (value_type_pointer)0x0;
  uVar14 = 0;
  do {
    lVar15 = uVar10 * 0x10;
    local_48 = (&boost::unordered::detail::foa::
                 dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                 ::storage)[lVar15];
    cStack_47 = (&DAT_00474ad1)[lVar15];
    cStack_46 = (&DAT_00474ad2)[lVar15];
    bStack_45 = (&DAT_00474ad3)[lVar15];
    cStack_44 = (&UNK_00474ad4)[lVar15];
    cStack_43 = (&DAT_00474ad5)[lVar15];
    cStack_42 = (&UNK_00474ad6)[lVar15];
    bStack_41 = (&UNK_00474ad7)[lVar15];
    cStack_40 = (&UNK_00474ad8)[lVar15];
    cStack_3f = (&UNK_00474ad9)[lVar15];
    cStack_3e = (&UNK_00474ada)[lVar15];
    bStack_3d = (&UNK_00474adb)[lVar15];
    cStack_3c = (&UNK_00474adc)[lVar15];
    cStack_3b = (&UNK_00474add)[lVar15];
    cStack_3a = (&UNK_00474ade)[lVar15];
    bStack_39 = (&DAT_00474adf)[lVar15];
    cVar19 = (char)uVar3;
    auVar28[0] = -(local_48 == cVar19);
    cVar23 = (char)((uint)uVar3 >> 8);
    auVar28[1] = -(cStack_47 == cVar23);
    cVar25 = (char)((uint)uVar3 >> 0x10);
    auVar28[2] = -(cStack_46 == cVar25);
    bVar27 = (byte)((uint)uVar3 >> 0x18);
    auVar28[3] = -(bStack_45 == bVar27);
    auVar28[4] = -(cStack_44 == cVar19);
    auVar28[5] = -(cStack_43 == cVar23);
    auVar28[6] = -(cStack_42 == cVar25);
    auVar28[7] = -(bStack_41 == bVar27);
    auVar28[8] = -(cStack_40 == cVar19);
    auVar28[9] = -(cStack_3f == cVar23);
    auVar28[10] = -(cStack_3e == cVar25);
    auVar28[0xb] = -(bStack_3d == bVar27);
    auVar28[0xc] = -(cStack_3c == cVar19);
    auVar28[0xd] = -(cStack_3b == cVar23);
    auVar28[0xe] = -(cStack_3a == cVar25);
    auVar28[0xf] = -(bStack_39 == bVar27);
    uVar16 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
    local_80 = this_00;
    if (uVar16 != 0) {
      do {
        iVar5 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        if ((*(long *)(uVar10 * 0xf0 + (ulong)(uint)(iVar5 << 4)) == 2) &&
           (**(short **)((ulong)(uint)(iVar5 << 4) + uVar10 * 0xf0 + 8) == 0x762e)) {
          bVar27 = 0x3f;
          local_a0 = 1;
          goto LAB_0018ce26;
        }
        uVar16 = uVar16 - 1 & uVar16;
      } while (uVar16 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & bStack_39) == 0) break;
    uVar14 = uVar14 + 1;
    uVar10 = (ulong)((int)uVar10 + (int)uVar14 & 1);
  } while (uVar14 < 2);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
            ((locator *)local_78,
             (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)arrays_,uVar8,&local_b0);
  bVar27 = (byte)(this->uniqueExtensions).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.groups_size_index;
  local_a0 = (this->uniqueExtensions).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_size_mask;
  pgVar12 = (this->uniqueExtensions).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .arrays.groups_;
  pbVar17 = (this->uniqueExtensions).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .arrays.elements_;
LAB_0018ce26:
  local_b0._M_len = 3;
  local_b0._M_str = ".sv";
  uVar8 = detail::hashing::hash(".sv",3);
  pos0 = uVar8 >> (bVar27 & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar8 & 0xff];
  uVar14 = 0;
  uVar10 = pos0;
  do {
    pgVar2 = pgVar12 + uVar10;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    uVar20 = (uchar)uVar3;
    auVar29[0] = -(local_58 == uVar20);
    uVar24 = (uchar)((uint)uVar3 >> 8);
    auVar29[1] = -(uStack_57 == uVar24);
    uVar26 = (uchar)((uint)uVar3 >> 0x10);
    auVar29[2] = -(uStack_56 == uVar26);
    bVar27 = (byte)((uint)uVar3 >> 0x18);
    auVar29[3] = -(bStack_55 == bVar27);
    auVar29[4] = -(uStack_54 == uVar20);
    auVar29[5] = -(uStack_53 == uVar24);
    auVar29[6] = -(uStack_52 == uVar26);
    auVar29[7] = -(bStack_51 == bVar27);
    auVar29[8] = -(uStack_50 == uVar20);
    auVar29[9] = -(uStack_4f == uVar24);
    auVar29[10] = -(uStack_4e == uVar26);
    auVar29[0xb] = -(bStack_4d == bVar27);
    auVar29[0xc] = -(uStack_4c == uVar20);
    auVar29[0xd] = -(uStack_4b == uVar24);
    auVar29[0xe] = -(uStack_4a == uVar26);
    auVar29[0xf] = -(bStack_49 == bVar27);
    for (uVar16 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar16 != 0;
        uVar16 = uVar16 - 1 & uVar16) {
      iVar5 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
        }
      }
      if ((*(long *)((long)&pbVar17[uVar10 * 0xf]._M_len + (ulong)(uint)(iVar5 << 4)) == 3) &&
         (psVar4 = *(short **)((long)&pbVar17[uVar10 * 0xf]._M_str + (ulong)(uint)(iVar5 << 4)),
         (char)psVar4[1] == 'v' && *psVar4 == 0x732e)) goto LAB_0018cf43;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & bStack_49) == 0) break;
    lVar15 = uVar10 + uVar14;
    uVar14 = uVar14 + 1;
    uVar10 = lVar15 + 1U & local_a0;
  } while (uVar14 <= local_a0);
  if ((this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.size <
      (this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_78,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)arrays_,(arrays_type *)arrays_,pos0,uVar8,&local_b0);
    psVar1 = &(this->uniqueExtensions).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_78,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)arrays_,uVar8,&local_b0);
  }
LAB_0018cf43:
  iVar30 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin(&arrays_->table_);
  if (iVar30.p_ == (table_element_pointer)0x0) {
    return;
  }
LAB_0018cf65:
  do {
    local_78._0_8_ = (iVar30.p_)->_M_len;
    local_78._8_8_ = (iVar30.p_)->_M_str;
    std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                *)&this->searchExtensions,
               (basic_string_view<char,_std::char_traits<char>_> *)local_78);
    puVar11 = iVar30.pc_ + 0x12;
    puVar13 = iVar30.pc_ + 2;
    while( true ) {
      puVar9 = puVar13;
      puVar13 = iVar30.pc_;
      pbVar18 = iVar30.p_ + 1;
      if (((uint)iVar30.pc_ & 0xf) == 0xe) break;
      iVar30.p_ = pbVar18;
      iVar30.pc_ = puVar13 + 1;
      puVar11 = puVar11 + 1;
      puVar13 = puVar9 + 1;
      if (puVar9[-1] != '\0') goto code_r0x0018cfa9;
    }
    auVar21[0] = -(*puVar9 == '\0');
    auVar21[1] = -(puVar9[1] == '\0');
    auVar21[2] = -(puVar9[2] == '\0');
    auVar21[3] = -(puVar9[3] == '\0');
    auVar21[4] = -(puVar9[4] == '\0');
    auVar21[5] = -(puVar9[5] == '\0');
    auVar21[6] = -(puVar9[6] == '\0');
    auVar21[7] = -(puVar9[7] == '\0');
    auVar21[8] = -(puVar9[8] == '\0');
    auVar21[9] = -(puVar9[9] == '\0');
    auVar21[10] = -(puVar9[10] == '\0');
    auVar21[0xb] = -(puVar9[0xb] == '\0');
    auVar21[0xc] = -(puVar9[0xc] == '\0');
    auVar21[0xd] = -(puVar9[0xd] == '\0');
    auVar21[0xe] = -(puVar9[0xe] == '\0');
    auVar21[0xf] = -(puVar9[0xf] == '\0');
    uVar6 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe;
    while (uVar6 == 0x7fff) {
      pbVar18 = pbVar18 + 0xf;
      auVar22[0] = -(*puVar11 == '\0');
      auVar22[1] = -(puVar11[1] == '\0');
      auVar22[2] = -(puVar11[2] == '\0');
      auVar22[3] = -(puVar11[3] == '\0');
      auVar22[4] = -(puVar11[4] == '\0');
      auVar22[5] = -(puVar11[5] == '\0');
      auVar22[6] = -(puVar11[6] == '\0');
      auVar22[7] = -(puVar11[7] == '\0');
      auVar22[8] = -(puVar11[8] == '\0');
      auVar22[9] = -(puVar11[9] == '\0');
      auVar22[10] = -(puVar11[10] == '\0');
      auVar22[0xb] = -(puVar11[0xb] == '\0');
      auVar22[0xc] = -(puVar11[0xc] == '\0');
      auVar22[0xd] = -(puVar11[0xd] == '\0');
      auVar22[0xe] = -(puVar11[0xe] == '\0');
      auVar22[0xf] = -(puVar11[0xf] == '\0');
      puVar9 = puVar11;
      puVar11 = puVar11 + 0x10;
      uVar6 = (ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe;
    }
    uVar16 = 0;
    if ((uVar6 ^ 0x7fff) != 0) {
      for (; ((uVar6 ^ 0x7fff) >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
    }
    if (puVar9[uVar16] == '\x01') {
      return;
    }
    iVar30.p_ = (table_element_pointer)((long)&pbVar18->_M_len + (ulong)(uVar16 << 4));
    iVar30.pc_ = puVar9 + uVar16;
  } while( true );
code_r0x0018cfa9:
  if (puVar9[-1] == '\x01') {
    return;
  }
  iVar30.pc_ = puVar9 + -1;
  goto LAB_0018cf65;
}

Assistant:

SourceLoader::SourceLoader(SourceManager& sourceManager) : sourceManager(sourceManager) {
    // When searching for library modules we will always include these extensions
    // in addition to anything the user provides.
    uniqueExtensions.emplace(".v"sv);
    uniqueExtensions.emplace(".sv"sv);
    for (auto ext : uniqueExtensions)
        searchExtensions.emplace_back(ext);
}